

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O0

void __thiscall luna::VM::Return(VM *this,Value *a,Instruction i)

{
  bool bVar1;
  int *piVar2;
  Instruction in_EDX;
  anon_union_8_9_8deb4486_for_Value_0 *in_RSI;
  Value *in_RDI;
  int count;
  int i_2;
  int i_1;
  int result_count;
  int expect_result;
  Value *dst;
  Value *src;
  value_type *call;
  int ret_value_count;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  Value *local_38;
  anon_union_8_9_8deb4486_for_Value_0 *local_30;
  reference local_28;
  int local_1c;
  anon_union_8_9_8deb4486_for_Value_0 *local_18;
  
  local_18 = in_RSI;
  local_1c = Instruction::GetParamsBx(in_EDX);
  if (local_1c != -1) {
    *(anon_union_8_9_8deb4486_for_Value_0 **)((in_RDI->field_0).cfunc_ + 0x40) =
         local_18 + (long)local_1c * 2;
  }
  bVar1 = std::__cxx11::list<luna::CallInfo,_std::allocator<luna::CallInfo>_>::empty
                    ((list<luna::CallInfo,_std::allocator<luna::CallInfo>_> *)
                     ((in_RDI->field_0).cfunc_ + 0x48));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_28 = std::__cxx11::list<luna::CallInfo,_std::allocator<luna::CallInfo>_>::back
                         ((list<luna::CallInfo,_std::allocator<luna::CallInfo>_> *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    local_30 = local_18;
    local_38 = local_28->func_;
    local_3c = local_28->expect_result_;
    local_40 = (int)(*(long *)((in_RDI->field_0).cfunc_ + 0x40) - (long)local_18 >> 4);
    if (local_3c == -1) {
      for (local_44 = 0; local_44 < local_40; local_44 = local_44 + 1) {
        local_38->field_0 = *local_30;
        local_38->type_ = *(ValueT *)(local_30 + 1);
        local_38 = local_38 + 1;
        local_30 = local_30 + 2;
      }
    }
    else {
      local_48 = 0;
      piVar2 = std::min<int>(&local_3c,&local_40);
      in_stack_ffffffffffffffb4 = *piVar2;
      for (; local_48 < in_stack_ffffffffffffffb4; local_48 = local_48 + 1) {
        local_38->field_0 = *local_30;
        local_38->type_ = *(ValueT *)(local_30 + 1);
        local_38 = local_38 + 1;
        local_30 = local_30 + 2;
      }
      for (; local_48 < local_3c; local_48 = local_48 + 1) {
        Value::SetNil(local_38);
        local_38 = local_38 + 1;
      }
    }
    Stack::SetNewTop((Stack *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RDI);
    std::__cxx11::list<luna::CallInfo,_std::allocator<luna::CallInfo>_>::pop_back
              ((list<luna::CallInfo,_std::allocator<luna::CallInfo>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    return;
  }
  __assert_fail("!state_->calls_.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/VM.cpp",
                0x199,"void luna::VM::Return(Value *, Instruction)");
}

Assistant:

void VM::Return(Value *a, Instruction i)
    {
        // Set stack top when return value count is fixed
        int ret_value_count = Instruction::GetParamsBx(i);
        if (ret_value_count != EXP_VALUE_COUNT_ANY)
            state_->stack_.top_ = a + ret_value_count;

        assert(!state_->calls_.empty());
        auto call = &state_->calls_.back();

        auto src = a;
        auto dst = call->func_;

        int expect_result = call->expect_result_;
        int result_count = state_->stack_.top_ - src;
        if (expect_result == EXP_VALUE_COUNT_ANY)
        {
            for (int i = 0; i < result_count; ++i)
                *dst++ = *src++;
        }
        else
        {
            int i = 0;
            int count = std::min(expect_result, result_count);
            for (; i < count; ++i)
                *dst++ = *src++;
            // No enough results for expect results, set remain as nil
            for (; i < expect_result; ++i, ++dst)
                dst->SetNil();
        }

        // Set new top and pop current CallInfo
        state_->stack_.SetNewTop(dst);
        state_->calls_.pop_back();
    }